

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureCubeMapArrayImageOpCompute::iterate(TextureCubeMapArrayImageOpCompute *this)

{
  GLuint width_00;
  GLuint height_00;
  GLuint depth_00;
  GLuint GVar1;
  GLuint GVar2;
  Context *pCVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  ContextType type;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  GLuint depth;
  GLuint height;
  GLuint width;
  GLuint res_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uIntClean;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uIntData;
  vector<int,_std::allocator<int>_> intClean;
  vector<int,_std::allocator<int>_> intData;
  vector<float,_std::allocator<float>_> floatClean;
  vector<float,_std::allocator<float>_> floatData;
  bool test_passed;
  Functions *gl;
  TextureCubeMapArrayImageOpCompute *this_local;
  long lVar9;
  
  initTest(this);
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar9 + 0x1680))(this->m_po_id);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"Error setting active program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,0x209);
  bVar4 = true;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width);
  for (height = 0; height < 4; height = height + 1) {
    width_00 = *(GLuint *)(m_resolutions + (ulong)height * 0xc);
    height_00 = *(GLuint *)(m_resolutions + (ulong)height * 0xc + 4);
    depth_00 = *(GLuint *)(m_resolutions + (ulong)height * 0xc + 8);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)
               &floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (ulong)(width_00 * height_00 * depth_00 * 4));
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)
               &intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (ulong)(width_00 * height_00 * depth_00 * 4));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               &intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (ulong)(width_00 * height_00 * depth_00 * 4));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               &uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (ulong)(width_00 * height_00 * depth_00 * 4));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (ulong)(width_00 * height_00 * depth_00 * 4));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width,
               (ulong)(width_00 * height_00 * depth_00 * 4));
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)
                         &intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    memset(pvVar10,0,(ulong)(width_00 * height_00 * depth_00 * 4) << 2);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    memset(pvVar11,0,(ulong)(width_00 * height_00 * depth_00 * 4) << 2);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width,0);
    memset(pvVar12,0,(ulong)(width_00 * height_00 * depth_00 * 4) << 2);
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)
                         &floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    fillData<float>(pvVar10,width_00,height_00,depth_00,4,1.5);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    fillData<int>(pvVar11,width_00,height_00,depth_00,4,-1);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    fillData<unsigned_int>(pvVar12,width_00,height_00,depth_00,4,1);
    pRVar8 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    type.super_ApiType.m_bits = (ApiType)(*pRVar8->_vptr_RenderContext[2])();
    bVar5 = glu::isContextTypeES(type);
    if (!bVar5) {
      pCVar3 = (this->super_TestCaseBase).m_context;
      pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)
                           &floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
      configureTexture<float>
                (pCVar3,&this->m_image_read_to_id,width_00,height_00,depth_00,ST_MUTABLE,0x8814,
                 0x1908,0x1406,pvVar10);
      pCVar3 = (this->super_TestCaseBase).m_context;
      pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)
                           &intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
      configureTexture<float>
                (pCVar3,&this->m_image_write_to_id,width_00,height_00,depth_00,ST_MUTABLE,0x8814,
                 0x1908,0x1406,pvVar10);
      pCVar3 = (this->super_TestCaseBase).m_context;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
      configureTexture<int>
                (pCVar3,&this->m_iimage_read_to_id,width_00,height_00,depth_00,ST_MUTABLE,0x8d82,
                 0x8d99,0x1404,pvVar11);
      pCVar3 = (this->super_TestCaseBase).m_context;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      configureTexture<int>
                (pCVar3,&this->m_iimage_write_to_id,width_00,height_00,depth_00,ST_MUTABLE,0x8d82,
                 0x8d99,0x1404,pvVar11);
      pCVar3 = (this->super_TestCaseBase).m_context;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &uIntClean.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
      configureTexture<unsigned_int>
                (pCVar3,&this->m_uimage_read_to_id,width_00,height_00,depth_00,ST_MUTABLE,0x8d70,
                 0x8d99,0x1405,pvVar12);
      pCVar3 = (this->super_TestCaseBase).m_context;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width,0);
      configureTexture<unsigned_int>
                (pCVar3,&this->m_uimage_write_to_id,width_00,height_00,depth_00,ST_MUTABLE,0x8d70,
                 0x8d99,0x1405,pvVar12);
      (**(code **)(lVar9 + 0x80))(0,this->m_image_read_to_id,0,1,0,35000,0x8814);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x248);
      (**(code **)(lVar9 + 0x80))(1,this->m_iimage_read_to_id,0,1,0,35000,0x8d82);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x24a);
      (**(code **)(lVar9 + 0x80))(2,this->m_uimage_read_to_id,0,1,0,35000,0x8d70);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x24c);
      (**(code **)(lVar9 + 0x80))(3,this->m_image_write_to_id,0,1,0,0x88b9,0x8814);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x24f);
      (**(code **)(lVar9 + 0x80))(4,this->m_iimage_write_to_id,0,1,0,0x88b9,0x8d82);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x252);
      (**(code **)(lVar9 + 0x80))(5,this->m_uimage_write_to_id,0,1,0,0x88b9,0x8d70);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"Error binding texture object to image unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x255);
      runShaders(this,width_00,height_00,depth_00);
      pCVar3 = (this->super_TestCaseBase).m_context;
      GVar1 = this->m_copy_po_id;
      GVar2 = this->m_image_write_to_id;
      pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)
                           &floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
      bVar5 = checkResults<float>(pCVar3,GVar1,GVar2,width_00,height_00,depth_00,4,0x1908,0x1406,
                                  ST_MUTABLE,pvVar10);
      if (!bVar5) {
        bVar4 = false;
      }
      pCVar3 = (this->super_TestCaseBase).m_context;
      GVar1 = this->m_copy_po_id;
      GVar2 = this->m_iimage_write_to_id;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
      bVar5 = checkResults<int>(pCVar3,GVar1,GVar2,width_00,height_00,depth_00,4,0x8d99,0x1404,
                                ST_MUTABLE,pvVar11);
      if (!bVar5) {
        bVar4 = false;
      }
      pCVar3 = (this->super_TestCaseBase).m_context;
      GVar1 = this->m_copy_po_id;
      GVar2 = this->m_uimage_write_to_id;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &uIntClean.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
      bVar5 = checkResults<unsigned_int>
                        (pCVar3,GVar1,GVar2,width_00,height_00,depth_00,4,0x8d99,0x1405,ST_MUTABLE,
                         pvVar12);
      if (!bVar5) {
        bVar4 = false;
      }
      removeTextures(this);
    }
    pCVar3 = (this->super_TestCaseBase).m_context;
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)
                         &floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    configureTexture<float>
              (pCVar3,&this->m_image_read_to_id,width_00,height_00,depth_00,ST_IMMUTABLE,0x8814,
               0x1908,0x1406,pvVar10);
    pCVar3 = (this->super_TestCaseBase).m_context;
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)
                         &intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    configureTexture<float>
              (pCVar3,&this->m_image_write_to_id,width_00,height_00,depth_00,ST_IMMUTABLE,0x8814,
               0x1908,0x1406,pvVar10);
    pCVar3 = (this->super_TestCaseBase).m_context;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    configureTexture<int>
              (pCVar3,&this->m_iimage_read_to_id,width_00,height_00,depth_00,ST_IMMUTABLE,0x8d82,
               0x8d99,0x1404,pvVar11);
    pCVar3 = (this->super_TestCaseBase).m_context;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    configureTexture<int>
              (pCVar3,&this->m_iimage_write_to_id,width_00,height_00,depth_00,ST_IMMUTABLE,0x8d82,
               0x8d99,0x1404,pvVar11);
    pCVar3 = (this->super_TestCaseBase).m_context;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    configureTexture<unsigned_int>
              (pCVar3,&this->m_uimage_read_to_id,width_00,height_00,depth_00,ST_IMMUTABLE,0x8d70,
               0x8d99,0x1405,pvVar12);
    pCVar3 = (this->super_TestCaseBase).m_context;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width,0);
    configureTexture<unsigned_int>
              (pCVar3,&this->m_uimage_write_to_id,width_00,height_00,depth_00,ST_IMMUTABLE,0x8d70,
               0x8d99,0x1405,pvVar12);
    (**(code **)(lVar9 + 0x80))(0,this->m_image_read_to_id,0,1,0,35000,0x8814);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x285);
    (**(code **)(lVar9 + 0x80))(1,this->m_iimage_read_to_id,0,1,0,35000,0x8d82);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x287);
    (**(code **)(lVar9 + 0x80))(2,this->m_uimage_read_to_id,0,1,0,35000,0x8d70);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x289);
    (**(code **)(lVar9 + 0x80))(3,this->m_image_write_to_id,0,1,0,0x88b9,0x8814);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x28c);
    (**(code **)(lVar9 + 0x80))(4,this->m_iimage_write_to_id,0,1,0,0x88b9,0x8d82);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x28f);
    (**(code **)(lVar9 + 0x80))(5,this->m_uimage_write_to_id,0,1,0,0x88b9,0x8d70);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Error binding texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x292);
    runShaders(this,width_00,height_00,depth_00);
    pCVar3 = (this->super_TestCaseBase).m_context;
    GVar1 = this->m_copy_po_id;
    GVar2 = this->m_image_write_to_id;
    pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)
                         &floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    bVar5 = checkResults<float>(pCVar3,GVar1,GVar2,width_00,height_00,depth_00,4,0x1908,0x1406,
                                ST_IMMUTABLE,pvVar10);
    if (!bVar5) {
      bVar4 = false;
    }
    pCVar3 = (this->super_TestCaseBase).m_context;
    GVar1 = this->m_copy_po_id;
    GVar2 = this->m_iimage_write_to_id;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    bVar5 = checkResults<int>(pCVar3,GVar1,GVar2,width_00,height_00,depth_00,4,0x8d99,0x1404,
                              ST_IMMUTABLE,pvVar11);
    if (!bVar5) {
      bVar4 = false;
    }
    pCVar3 = (this->super_TestCaseBase).m_context;
    GVar1 = this->m_copy_po_id;
    GVar2 = this->m_uimage_write_to_id;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    bVar5 = checkResults<unsigned_int>
                      (pCVar3,GVar1,GVar2,width_00,height_00,depth_00,4,0x8d99,0x1405,ST_IMMUTABLE,
                       pvVar12);
    if (!bVar5) {
      bVar4 = false;
    }
    removeTextures(this);
  }
  if (bVar4) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&width);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &uIntClean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &uIntData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &intClean.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &intData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &floatClean.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArrayImageOpCompute::iterate()
{
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	bool test_passed = true;

	std::vector<glw::GLfloat> floatData;
	std::vector<glw::GLfloat> floatClean;
	std::vector<glw::GLint>   intData;
	std::vector<glw::GLint>   intClean;
	std::vector<glw::GLuint>  uIntData;
	std::vector<glw::GLuint>  uIntClean;

	/* Execute test throught all resolutions, storage types, and image types */
	for (glw::GLuint res_index = 0; res_index < m_n_resolutions; ++res_index)
	{
		glw::GLuint width  = m_resolutions[res_index][DL_WIDTH];
		glw::GLuint height = m_resolutions[res_index][DL_HEIGHT];
		glw::GLuint depth  = m_resolutions[res_index][DL_DEPTH];

		/* Allocate memory buffers for data */
		floatData.resize(width * height * depth * m_n_components);
		floatClean.resize(width * height * depth * m_n_components);
		intData.resize(width * height * depth * m_n_components);
		intClean.resize(width * height * depth * m_n_components);
		uIntData.resize(width * height * depth * m_n_components);
		uIntClean.resize(width * height * depth * m_n_components);

		memset(&floatClean[0], 0, width * height * depth * m_n_components * sizeof(glw::GLfloat));
		memset(&intClean[0], 0, width * height * depth * m_n_components * sizeof(glw::GLint));
		memset(&uIntClean[0], 0, width * height * depth * m_n_components * sizeof(glw::GLuint));

		/* Fill buffers with expected data*/
		fillData<glw::GLfloat>(&floatData[0], width, height, depth, m_n_components, m_f_base);
		fillData<glw::GLint>(&intData[0], width, height, depth, m_n_components, m_i_base);
		fillData<glw::GLuint>(&uIntData[0], width, height, depth, m_n_components, m_ui_base);

		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{

			/**
			 * Mutable textures cannot be bound as image textures on ES, but can be on
			 * desktop GL.
			 * */

			/* Work on mutable texture storage */

			/* Generate texture objects */
			configureTexture<glw::GLfloat>(m_context, &m_image_read_to_id, width, height, depth, ST_MUTABLE, GL_RGBA32F,
										   GL_RGBA, GL_FLOAT, &floatData[0]);
			configureTexture<glw::GLfloat>(m_context, &m_image_write_to_id, width, height, depth, ST_MUTABLE,
										   GL_RGBA32F, GL_RGBA, GL_FLOAT, &floatClean[0]);

			configureTexture<glw::GLint>(m_context, &m_iimage_read_to_id, width, height, depth, ST_MUTABLE, GL_RGBA32I,
										 GL_RGBA_INTEGER, GL_INT, &intData[0]);
			configureTexture<glw::GLint>(m_context, &m_iimage_write_to_id, width, height, depth, ST_MUTABLE, GL_RGBA32I,
										 GL_RGBA_INTEGER, GL_INT, &intClean[0]);

			configureTexture<glw::GLuint>(m_context, &m_uimage_read_to_id, width, height, depth, ST_MUTABLE,
										  GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &uIntData[0]);
			configureTexture<glw::GLuint>(m_context, &m_uimage_write_to_id, width, height, depth, ST_MUTABLE,
										  GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &uIntClean[0]);

			/* Bind texture objects to image units */
			gl.bindImageTexture(IF_IMAGE, m_image_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32F);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_IIMAGE, m_iimage_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32I);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_UIMAGE, m_uimage_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_IMAGE + m_n_image_formats, m_image_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
								GL_RGBA32F);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_IIMAGE + m_n_image_formats, m_iimage_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
								GL_RGBA32I);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
			gl.bindImageTexture(IF_UIMAGE + m_n_image_formats, m_uimage_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
								GL_RGBA32UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");

			/* Call shaders */
			runShaders(width, height, depth);

			/* Check results */
			if (!checkResults<glw::GLfloat>(m_context, m_copy_po_id, m_image_write_to_id, width, height, depth,
											m_n_components, GL_RGBA, GL_FLOAT, ST_MUTABLE, &floatData[0]))
			{
				test_passed = false;
			}

			if (!checkResults<glw::GLint>(m_context, m_copy_po_id, m_iimage_write_to_id, width, height, depth,
										  m_n_components, GL_RGBA_INTEGER, GL_INT, ST_MUTABLE, &intData[0]))
			{
				test_passed = false;
			}

			if (!checkResults<glw::GLuint>(m_context, m_copy_po_id, m_uimage_write_to_id, width, height, depth,
										   m_n_components, GL_RGBA_INTEGER, GL_UNSIGNED_INT, ST_MUTABLE, &uIntData[0]))
			{
				test_passed = false;
			}

			/* Delete textures */
			removeTextures();
		}

		/* Work on immutable texture storage */

		/* Generate texture objects */
		configureTexture<glw::GLfloat>(m_context, &m_image_read_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32F,
									   GL_RGBA, GL_FLOAT, &floatData[0]);
		configureTexture<glw::GLfloat>(m_context, &m_image_write_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32F,
									   GL_RGBA, GL_FLOAT, &floatClean[0]);

		configureTexture<glw::GLint>(m_context, &m_iimage_read_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32I,
									 GL_RGBA_INTEGER, GL_INT, &intData[0]);
		configureTexture<glw::GLint>(m_context, &m_iimage_write_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32I,
									 GL_RGBA_INTEGER, GL_INT, &intClean[0]);

		configureTexture<glw::GLuint>(m_context, &m_uimage_read_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32UI,
									  GL_RGBA_INTEGER, GL_UNSIGNED_INT, &uIntData[0]);
		configureTexture<glw::GLuint>(m_context, &m_uimage_write_to_id, width, height, depth, ST_IMMUTABLE, GL_RGBA32UI,
									  GL_RGBA_INTEGER, GL_UNSIGNED_INT, &uIntClean[0]);

		/* Bind texture objects to image units */
		gl.bindImageTexture(IF_IMAGE, m_image_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32F);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_IIMAGE, m_iimage_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32I);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_UIMAGE, m_uimage_read_to_id, 0, GL_TRUE, 0, GL_READ_ONLY, GL_RGBA32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_IMAGE + m_n_image_formats, m_image_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
							GL_RGBA32F);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_IIMAGE + m_n_image_formats, m_iimage_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
							GL_RGBA32I);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");
		gl.bindImageTexture(IF_UIMAGE + m_n_image_formats, m_uimage_write_to_id, 0, GL_TRUE, 0, GL_WRITE_ONLY,
							GL_RGBA32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit!");

		/* Call shaders */
		runShaders(width, height, depth);

		/* Check results */
		if (!checkResults<glw::GLfloat>(m_context, m_copy_po_id, m_image_write_to_id, width, height, depth,
										m_n_components, GL_RGBA, GL_FLOAT, ST_IMMUTABLE, &floatData[0]))
		{
			test_passed = false;
		}

		if (!checkResults<glw::GLint>(m_context, m_copy_po_id, m_iimage_write_to_id, width, height, depth,
									  m_n_components, GL_RGBA_INTEGER, GL_INT, ST_IMMUTABLE, &intData[0]))
		{
			test_passed = false;
		}

		if (!checkResults<glw::GLuint>(m_context, m_copy_po_id, m_uimage_write_to_id, width, height, depth,
									   m_n_components, GL_RGBA_INTEGER, GL_UNSIGNED_INT, ST_IMMUTABLE, &uIntData[0]))
		{
			test_passed = false;
		}

		/* Delete textures */
		removeTextures();
	}

	if (test_passed)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}